

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O0

void __thiscall tcu::Matrix<double,_4,_1>::Matrix(Matrix<double,_4,_1> *this)

{
  double *pdVar1;
  undefined8 local_28;
  undefined4 local_18;
  undefined4 local_14;
  int col;
  int row;
  Matrix<double,_4,_1> *this_local;
  
  Vector<tcu::Vector<double,_4>,_1>::Vector(&this->m_data);
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 1; local_18 = local_18 + 1) {
      local_28 = 1.0;
      if (local_14 != local_18) {
        local_28 = 0.0;
      }
      pdVar1 = operator()(this,local_14,local_18);
      *pdVar1 = local_28;
    }
  }
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (void)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = (row == col) ? T(1) : T(0);
}